

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

SampleBuilder * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,int v)

{
  Value local_18;
  
  local_18.value = (anon_union_8_2_07d0b834_for_value)(long)v;
  local_18.type = TYPE_INT64;
  std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
  emplace_back<tcu::SampleBuilder::Value>(&this->m_values,&local_18);
  return this;
}

Assistant:

SampleBuilder&			operator<<			(int v)		{ m_values.push_back(Value((deInt64)v));	return *this; }